

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

void * decrypt_thread(void *pargs)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ssize_t sVar5;
  ulong length;
  long lVar6;
  size_t ilen;
  ulong uVar7;
  sha256_context *psVar8;
  uint8_t *hash_00;
  sha256_context *psVar9;
  char *__ptr;
  long lVar10;
  byte bVar11;
  size_t sStack_8290;
  uint8_t iv [16];
  uint8_t hash [32];
  uint8_t next_iv [16];
  sha256_context ctx;
  sha256_context tmp;
  aes_context aes;
  uint8_t buffer [32800];
  
  bVar11 = 0;
  sVar5 = read_block(*pargs,iv,0x10);
  if (sVar5 < 0x10) {
    __ptr = "file too small! cannot read IV!\n";
    sStack_8290 = 0x20;
  }
  else {
    aes_init_dec(&aes,(uint8_t *)((long)pargs + 8),0x100);
    sha256_init(&ctx);
    sha256_starts(&ctx);
    lVar10 = 0x8010;
    while( true ) {
      length = read_block(*pargs,buffer,0x8020);
      if ((long)length < 1) break;
      uVar2 = *(undefined8 *)(buffer + (length - 0x10));
      uVar3 = *(undefined8 *)(buffer + (length - 8));
      aes_cbc_decrypt(&aes,iv,buffer,length,buffer);
      if (length != 0x8020) {
        lVar6 = length - 0x10;
        lVar10 = lVar10 + length;
        goto LAB_001025de;
      }
      sha256_update(&ctx,buffer,0x8000);
      sha256_copy(&tmp,&ctx);
      sha256_final(&tmp,hash);
      iVar4 = bcmp(buffer + 0x8000,hash,0x20);
      if (iVar4 != 0) {
        fprintf(_stderr,"hash mismatch at offset 0x%zx, (buffer size 0x%zx)\n",lVar10,0x8020);
        hash_00 = buffer + 0x8000;
        goto LAB_00102758;
      }
      write_block(*(int *)((long)pargs + 4),buffer,0x8000);
      lVar10 = lVar10 + 0x8020;
      iv._0_8_ = uVar2;
      iv._8_8_ = uVar3;
    }
    if (-1 < (long)length) {
      lVar6 = -0x10;
LAB_001025de:
      lVar10 = lVar10 + -0x8000;
      lVar1 = *(long *)(buffer + (length - 8));
      if (lVar1 == lVar10) {
        if (*(int *)(buffer + lVar6) + 0x30 <= length) {
          uVar7 = (ulong)(*(int *)(buffer + lVar6) + 0x10);
          ilen = (length - 0x20) - uVar7;
          sha256_update(&ctx,buffer,ilen);
          psVar8 = &ctx;
          psVar9 = &tmp;
          for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
            psVar9->total[0] = psVar8->total[0];
            psVar8 = (sha256_context *)((long)psVar8 + (ulong)bVar11 * -8 + 4);
            psVar9 = (sha256_context *)((long)psVar9 + (ulong)bVar11 * -8 + 4);
          }
          sha256_final(&tmp,hash);
          iVar4 = bcmp(buffer + ilen,hash,0x20);
          if (iVar4 == 0) {
            write_block(*(int *)((long)pargs + 4),buffer,ilen);
          }
          else {
            fprintf(_stderr,"hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n",
                    (lVar10 + (length - 0x20)) - uVar7,length);
            hash_00 = buffer + (length - 0x20);
LAB_00102758:
            print_hash("expected",hash_00);
            print_hash("actual",hash);
          }
        }
      }
      else {
        fprintf(_stderr,"read size mismatch. expected: 0x%llx, actual: 0x%zx\n",lVar1,lVar10);
      }
      goto LAB_00102676;
    }
    __ptr = "Read error occured!\n";
    sStack_8290 = 0x14;
  }
  fwrite(__ptr,sStack_8290,1,_stderr);
LAB_00102676:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *decrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t next_iv[AES_BLOCK_SIZE];
  uint8_t hash[SHA256_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE];
  ssize_t rd, total;

  // read iv
  if (read_block(args->in, iv, AES_BLOCK_SIZE) < AES_BLOCK_SIZE) {
    fprintf(stderr, "file too small! cannot read IV!\n");
    goto end;
  }

  // decrypt blocks
  aes_init_dec(&aes, args->key, 256);
  sha256_init(&ctx);
  sha256_starts(&ctx);
  total = AES_BLOCK_SIZE;
  while ((rd = read_block(args->in, buffer, sizeof(buffer))) > 0) {
    // save next iv
    memcpy(next_iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // decrypt
    aes_cbc_decrypt(&aes, iv, buffer, rd, buffer);

    if (rd != sizeof(buffer)) {
      total += rd;
      break; // last block requires special processing
    }

    // TODO: there's actually a bug in Sony's implementation where 
    // if the last block is exactly 0x8000 (before the SHA256) then 
    // it won't know about the last block and terminate in error. 
    // In other words, we don't have to handle this edge case... for now.

    // validate hash
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%zx, (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }

    // write output
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE);

    memcpy(iv, next_iv, AES_BLOCK_SIZE);
    total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // handle last block specially
  uint64_t exp_total;
  uint32_t exp_padding;

  exp_padding = le32toh(*(uint32_t *)&buffer[rd-0x10]);
  exp_total = le64toh(*(uint64_t *)&buffer[rd-0x8]);
  if (exp_total != total) {
    fprintf(stderr, "read size mismatch. expected: 0x%llx, actual: 0x%zx\n", exp_total, total);
    goto end;
  }
  exp_padding += 0x10;
  if (rd >= SHA256_BLOCK_SIZE + exp_padding) {
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
    tmp = ctx;
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE-exp_padding], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE - exp_padding, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
  }

end:
  close(args->out);
  close(args->in);
  return NULL;
}